

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O3

int plutovg_color_parse(plutovg_color_t *color,char *data,int length)

{
  byte *end;
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  ulong uVar4;
  _Bool _Var5;
  char *it_5;
  size_t sVar6;
  long lVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  void *pvVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  char *it;
  byte *pbVar19;
  char *it_7;
  ulong uVar20;
  byte *pbVar21;
  bool bVar22;
  bool bVar23;
  float a;
  float l;
  float s;
  float h;
  char name [21];
  byte *local_70;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  int local_58;
  undefined4 uStack_54;
  int local_50;
  char *local_38;
  
  if (length == -1) {
    sVar6 = strlen(data);
    length = (int)sVar6;
  }
  lVar7 = (long)length;
  end = (byte *)(data + lVar7);
  pbVar19 = (byte *)data;
  if (length < 1) {
LAB_00107ded:
    if ((pbVar19 < end) && (*pbVar19 == 0x23)) {
      pbVar1 = pbVar19 + 1;
      pbVar21 = pbVar1;
      local_70 = pbVar1;
      if (pbVar1 < end) {
        ppuVar8 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar8 + (long)(char)*pbVar21 * 2 + 1) & 0x10) == 0) break;
          pbVar21 = pbVar21 + 1;
          local_70 = pbVar21;
        } while (pbVar21 < end);
      }
      iVar12 = (int)pbVar21 - (int)pbVar1;
      if (iVar12 - 3U < 2) {
        bVar11 = *pbVar1;
        bVar14 = bVar11 - 0x30;
        if (9 < bVar14) {
          if ((byte)(bVar11 + 0x9f) < 6) {
            bVar14 = bVar11 + 0xa9;
          }
          else {
            bVar14 = bVar11 - 0x37;
          }
        }
        bVar11 = pbVar19[2];
        bVar16 = bVar11 - 0x30;
        if (9 < bVar16) {
          if ((byte)(bVar11 + 0x9f) < 6) {
            bVar16 = bVar11 + 0xa9;
          }
          else {
            bVar16 = bVar11 - 0x37;
          }
        }
        bVar11 = pbVar19[3];
        bVar17 = bVar11 - 0x30;
        if (9 < bVar17) {
          if ((byte)(bVar11 + 0x9f) < 6) {
            bVar17 = bVar11 + 0xa9;
          }
          else {
            bVar17 = bVar11 - 0x37;
          }
        }
        bVar14 = bVar14 | bVar14 << 4;
        bVar16 = bVar16 | bVar16 << 4;
        bVar17 = bVar17 << 4 | bVar17;
        bVar11 = 0xff;
        if (iVar12 == 4) {
          bVar18 = pbVar19[4];
          bVar11 = bVar18 - 0x30;
          bVar15 = bVar11;
          if (9 < bVar11) {
            if ((byte)(bVar18 + 0x9f) < 6) {
              bVar11 = bVar18 + 0xa9;
              bVar15 = bVar11;
            }
            else {
              bVar11 = bVar18 - 0x37;
              bVar15 = bVar11;
            }
          }
LAB_00108510:
          bVar11 = bVar15 << 4 | bVar11;
        }
      }
      else {
        if ((iVar12 != 8) && (iVar12 != 6)) {
          return 0;
        }
        bVar14 = pbVar19[1];
        bVar15 = pbVar19[2];
        bVar11 = bVar14 - 0x30;
        if (9 < bVar11) {
          if ((byte)(bVar14 + 0x9f) < 6) {
            bVar11 = bVar14 + 0xa9;
          }
          else {
            bVar11 = bVar14 - 0x37;
          }
        }
        bVar14 = bVar15 - 0x30;
        if (9 < bVar14) {
          if ((byte)(bVar15 + 0x9f) < 6) {
            bVar14 = bVar15 + 0xa9;
          }
          else {
            bVar14 = bVar15 - 0x37;
          }
        }
        bVar16 = pbVar19[3];
        bVar18 = pbVar19[4];
        bVar15 = bVar16 - 0x30;
        if (9 < bVar15) {
          if ((byte)(bVar16 + 0x9f) < 6) {
            bVar15 = bVar16 + 0xa9;
          }
          else {
            bVar15 = bVar16 - 0x37;
          }
        }
        bVar16 = bVar18 - 0x30;
        if (9 < bVar16) {
          if ((byte)(bVar18 + 0x9f) < 6) {
            bVar16 = bVar18 + 0xa9;
          }
          else {
            bVar16 = bVar18 - 0x37;
          }
        }
        bVar17 = pbVar19[5];
        bVar2 = pbVar19[6];
        bVar18 = bVar17 - 0x30;
        if (9 < bVar18) {
          if ((byte)(bVar17 + 0x9f) < 6) {
            bVar18 = bVar17 + 0xa9;
          }
          else {
            bVar18 = bVar17 - 0x37;
          }
        }
        bVar17 = bVar2 - 0x30;
        if (9 < bVar17) {
          if ((byte)(bVar2 + 0x9f) < 6) {
            bVar17 = bVar2 + 0xa9;
          }
          else {
            bVar17 = bVar2 - 0x37;
          }
        }
        bVar14 = bVar14 | bVar11 << 4;
        bVar16 = bVar16 | bVar15 << 4;
        bVar17 = bVar18 << 4 | bVar17;
        bVar11 = 0xff;
        if (iVar12 == 8) {
          bVar11 = pbVar19[7];
          bVar18 = pbVar19[8];
          bVar15 = bVar11 - 0x30;
          if (9 < bVar15) {
            if ((byte)(bVar11 + 0x9f) < 6) {
              bVar15 = bVar11 + 0xa9;
            }
            else {
              bVar15 = bVar11 - 0x37;
            }
          }
          bVar11 = bVar18 - 0x30;
          if (9 < bVar11) {
            if ((byte)(bVar18 + 0x9f) < 6) {
              bVar11 = bVar18 + 0xa9;
            }
            else {
              bVar11 = bVar18 - 0x37;
            }
          }
          goto LAB_00108510;
        }
      }
      plutovg_color_init_rgba8(color,(uint)bVar14,(uint)bVar16,(uint)bVar17,(uint)bVar11);
      goto LAB_0010852d;
    }
    pbVar21 = pbVar19;
    if (end <= pbVar19) goto LAB_00107ebf;
    local_70 = pbVar19;
    local_38 = data;
    ppuVar8 = __ctype_b_loc();
    puVar3 = *ppuVar8;
    uVar20 = 0;
    while (bVar11 = pbVar19[uVar20], (*(byte *)((long)puVar3 + (long)(char)bVar11 * 2 + 1) & 4) != 0
          ) {
      pp_Var9 = __ctype_tolower_loc();
      uVar13 = uVar20 + 1;
      *(char *)((long)&local_58 + uVar20) = (char)(*pp_Var9)[(char)bVar11];
      bVar23 = pbVar19 + uVar20 + 1 < end;
      uVar4 = uVar13;
      if ((!bVar23) || (bVar22 = 0x12 < uVar20, uVar20 = uVar13, bVar22)) goto LAB_00107ecb;
    }
    bVar23 = true;
    uVar13 = uVar20 & 0xffffffff;
    uVar4 = uVar20;
LAB_00107ecb:
    pbVar21 = pbVar19 + uVar4;
    uVar13 = uVar13 & 0xffffffff;
    data = local_38;
  }
  else {
    do {
      if ((0x20 < (ulong)*pbVar19) || ((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0))
      goto LAB_00107ded;
      lVar7 = lVar7 + -1;
      pbVar21 = end;
      pbVar19 = pbVar19 + 1;
    } while (lVar7 != 0);
LAB_00107ebf:
    uVar13 = 0;
    bVar23 = false;
  }
  *(undefined1 *)((long)&local_58 + uVar13) = 0;
  if (local_50 == 0x746e65 && CONCAT44(uStack_54,local_58) == 0x726170736e617274) {
    color->r = 0.0;
    color->g = 0.0;
    color->b = 0.0;
    color->a = 0.0;
LAB_0010852d:
    pbVar19 = pbVar21;
    if (pbVar21 < end) {
      do {
        pbVar19 = pbVar21;
        if ((0x20 < (ulong)*pbVar21) || ((0x100002600U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0))
        break;
        pbVar21 = pbVar21 + 1;
        pbVar19 = end;
      } while (pbVar21 != end);
    }
    return (int)pbVar19 - (int)data;
  }
  if ((local_58 == 0x626772) || ((char)uStack_54 == '\0' && local_58 == 0x61626772)) {
    if (bVar23) {
      bVar23 = true;
      do {
        pbVar19 = pbVar21;
        if ((0x20 < (ulong)*pbVar21) || ((0x100002600U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0))
        break;
        pbVar21 = pbVar21 + 1;
        bVar23 = pbVar21 < end;
        pbVar19 = end;
      } while (pbVar21 != end);
      if (((bVar23) && (pbVar19 < end)) && (*pbVar19 == 0x28)) {
        pbVar19 = pbVar19 + 1;
        local_70 = pbVar19;
        if (pbVar19 < end) {
          do {
            local_70 = pbVar19;
            if ((0x20 < (ulong)*pbVar19) || ((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0))
            break;
            pbVar19 = pbVar19 + 1;
            local_70 = end;
          } while (pbVar19 != end);
        }
        if (local_70 < end) {
          local_68 = 1.0;
          _Var5 = parse_rgb_component((char **)&local_70,(char *)end,&local_5c);
          if ((_Var5) && (local_70 < end)) {
            bVar23 = true;
            do {
              pbVar19 = local_70;
              if ((0x20 < (ulong)*local_70) ||
                 ((0x100002600U >> ((ulong)*local_70 & 0x3f) & 1) == 0)) break;
              local_70 = local_70 + 1;
              bVar23 = local_70 < end;
              pbVar19 = end;
            } while (local_70 != end);
            if (((bVar23) && (pbVar19 < end)) && (*pbVar19 == 0x2c)) {
              pbVar19 = pbVar19 + 1;
              local_70 = pbVar19;
              if (pbVar19 < end) {
                do {
                  local_70 = pbVar19;
                  if ((0x20 < (ulong)*pbVar19) ||
                     ((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0)) break;
                  pbVar19 = pbVar19 + 1;
                  local_70 = end;
                } while (pbVar19 != end);
              }
              if ((((local_70 < end) &&
                   (_Var5 = parse_rgb_component((char **)&local_70,(char *)end,&local_60), _Var5))
                  && ((_Var5 = plutovg_skip_ws_and_comma((char **)&local_70,(char *)end), _Var5 &&
                      (_Var5 = parse_rgb_component((char **)&local_70,(char *)end,&local_64), _Var5)
                      ))) &&
                 ((_Var5 = plutovg_skip_ws_and_comma((char **)&local_70,(char *)end), !_Var5 ||
                  (_Var5 = parse_alpha_component((char **)&local_70,(char *)end,&local_68), _Var5)))
                 ) {
                pbVar21 = local_70;
                if (local_70 < end) {
                  do {
                    pbVar21 = local_70;
                    if ((0x20 < (ulong)*local_70) ||
                       ((0x100002600U >> ((ulong)*local_70 & 0x3f) & 1) == 0)) break;
                    local_70 = local_70 + 1;
                    pbVar21 = end;
                  } while (local_70 != end);
                }
                if ((pbVar21 < end) && (*pbVar21 == 0x29)) {
                  pbVar21 = pbVar21 + 1;
                  local_70 = pbVar21;
                  plutovg_color_init_rgba(color,local_5c,local_60,local_64,local_68);
                  goto LAB_0010852d;
                }
              }
            }
          }
        }
      }
    }
  }
  else if ((local_58 == 0x6c7368) || ((char)uStack_54 == '\0' && local_58 == 0x616c7368)) {
    if (bVar23) {
      bVar23 = true;
      do {
        pbVar19 = pbVar21;
        if ((0x20 < (ulong)*pbVar21) || ((0x100002600U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0))
        break;
        pbVar21 = pbVar21 + 1;
        bVar23 = pbVar21 < end;
        pbVar19 = end;
      } while (pbVar21 != end);
      if (((bVar23) && (pbVar19 < end)) && (*pbVar19 == 0x28)) {
        pbVar19 = pbVar19 + 1;
        local_70 = pbVar19;
        if (pbVar19 < end) {
          do {
            local_70 = pbVar19;
            if ((0x20 < (ulong)*pbVar19) || ((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0))
            break;
            pbVar19 = pbVar19 + 1;
            local_70 = end;
          } while (pbVar19 != end);
        }
        if (local_70 < end) {
          local_68 = 1.0;
          _Var5 = plutovg_parse_number((char **)&local_70,(char *)end,&local_5c);
          if ((((_Var5) &&
               (_Var5 = plutovg_skip_ws_and_comma((char **)&local_70,(char *)end), _Var5)) &&
              ((_Var5 = parse_alpha_component((char **)&local_70,(char *)end,&local_60), _Var5 &&
               ((_Var5 = plutovg_skip_ws_and_comma((char **)&local_70,(char *)end), _Var5 &&
                (_Var5 = parse_alpha_component((char **)&local_70,(char *)end,&local_64), _Var5)))))
              ) && ((_Var5 = plutovg_skip_ws_and_comma((char **)&local_70,(char *)end), !_Var5 ||
                    (_Var5 = parse_alpha_component((char **)&local_70,(char *)end,&local_68), _Var5)
                    ))) {
            pbVar21 = local_70;
            if (local_70 < end) {
              do {
                pbVar21 = local_70;
                if ((0x20 < (ulong)*local_70) ||
                   ((0x100002600U >> ((ulong)*local_70 & 0x3f) & 1) == 0)) break;
                local_70 = local_70 + 1;
                pbVar21 = end;
              } while (local_70 != end);
            }
            if ((pbVar21 < end) && (*pbVar21 == 0x29)) {
              pbVar21 = pbVar21 + 1;
              local_70 = pbVar21;
              plutovg_color_init_hsla(color,local_5c,local_60,local_64,local_68);
              goto LAB_0010852d;
            }
          }
        }
      }
    }
  }
  else {
    local_70 = pbVar21;
    pvVar10 = bsearch(&local_58,plutovg_color_parse::colormap,0x94,0x10,color_entry_compare);
    if (pvVar10 != (void *)0x0) {
      plutovg_color_init_argb32(color,*(uint *)((long)pvVar10 + 8) | 0xff000000);
      goto LAB_0010852d;
    }
  }
  return 0;
}

Assistant:

int plutovg_color_parse(plutovg_color_t* color, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    plutovg_skip_ws(&it, end);
    if(plutovg_skip_delim(&it, end, '#')) {
        int r, g, b, a = 255;
        const char* begin = it;
        while(it < end && isxdigit(*it))
            ++it;
        int count = it - begin;
        if(count == 3 || count == 4) {
            r = hex_byte(begin[0], begin[0]);
            g = hex_byte(begin[1], begin[1]);
            b = hex_byte(begin[2], begin[2]);
            if(count == 4) {
                a = hex_byte(begin[3], begin[3]);
            }
        } else if(count == 6 || count == 8) {
            r = hex_byte(begin[0], begin[1]);
            g = hex_byte(begin[2], begin[3]);
            b = hex_byte(begin[4], begin[5]);
            if(count == 8) {
                a = hex_byte(begin[6], begin[7]);
            }
        } else {
            return 0;
        }

        plutovg_color_init_rgba8(color, r, g, b, a);
    } else {
        int name_length = 0;
        char name[MAX_NAME + 1];
        while(it < end && name_length < MAX_NAME && isalpha(*it))
            name[name_length++] = tolower(*it++);
        name[name_length] = '\0';

        if(strcmp(name, "transparent") == 0) {
            plutovg_color_init_rgba(color, 0, 0, 0, 0);
        } else if(strcmp(name, "rgb") == 0 || strcmp(name, "rgba") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float r, g, b, a = 1.f;
            if(!parse_rgb_component(&it, end, &r)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &g)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &b)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_rgba(color, r, g, b, a);
        } else if(strcmp(name, "hsl") == 0 || strcmp(name, "hsla") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float h, s, l, a = 1.f;
            if(!plutovg_parse_number(&it, end, &h)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &s)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &l)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_hsla(color, h, s, l, a);
        } else {
            static const color_entry_t colormap[] = {
                {"aliceblue", 0xF0F8FF},
                {"antiquewhite", 0xFAEBD7},
                {"aqua", 0x00FFFF},
                {"aquamarine", 0x7FFFD4},
                {"azure", 0xF0FFFF},
                {"beige", 0xF5F5DC},
                {"bisque", 0xFFE4C4},
                {"black", 0x000000},
                {"blanchedalmond", 0xFFEBCD},
                {"blue", 0x0000FF},
                {"blueviolet", 0x8A2BE2},
                {"brown", 0xA52A2A},
                {"burlywood", 0xDEB887},
                {"cadetblue", 0x5F9EA0},
                {"chartreuse", 0x7FFF00},
                {"chocolate", 0xD2691E},
                {"coral", 0xFF7F50},
                {"cornflowerblue", 0x6495ED},
                {"cornsilk", 0xFFF8DC},
                {"crimson", 0xDC143C},
                {"cyan", 0x00FFFF},
                {"darkblue", 0x00008B},
                {"darkcyan", 0x008B8B},
                {"darkgoldenrod", 0xB8860B},
                {"darkgray", 0xA9A9A9},
                {"darkgreen", 0x006400},
                {"darkgrey", 0xA9A9A9},
                {"darkkhaki", 0xBDB76B},
                {"darkmagenta", 0x8B008B},
                {"darkolivegreen", 0x556B2F},
                {"darkorange", 0xFF8C00},
                {"darkorchid", 0x9932CC},
                {"darkred", 0x8B0000},
                {"darksalmon", 0xE9967A},
                {"darkseagreen", 0x8FBC8F},
                {"darkslateblue", 0x483D8B},
                {"darkslategray", 0x2F4F4F},
                {"darkslategrey", 0x2F4F4F},
                {"darkturquoise", 0x00CED1},
                {"darkviolet", 0x9400D3},
                {"deeppink", 0xFF1493},
                {"deepskyblue", 0x00BFFF},
                {"dimgray", 0x696969},
                {"dimgrey", 0x696969},
                {"dodgerblue", 0x1E90FF},
                {"firebrick", 0xB22222},
                {"floralwhite", 0xFFFAF0},
                {"forestgreen", 0x228B22},
                {"fuchsia", 0xFF00FF},
                {"gainsboro", 0xDCDCDC},
                {"ghostwhite", 0xF8F8FF},
                {"gold", 0xFFD700},
                {"goldenrod", 0xDAA520},
                {"gray", 0x808080},
                {"green", 0x008000},
                {"greenyellow", 0xADFF2F},
                {"grey", 0x808080},
                {"honeydew", 0xF0FFF0},
                {"hotpink", 0xFF69B4},
                {"indianred", 0xCD5C5C},
                {"indigo", 0x4B0082},
                {"ivory", 0xFFFFF0},
                {"khaki", 0xF0E68C},
                {"lavender", 0xE6E6FA},
                {"lavenderblush", 0xFFF0F5},
                {"lawngreen", 0x7CFC00},
                {"lemonchiffon", 0xFFFACD},
                {"lightblue", 0xADD8E6},
                {"lightcoral", 0xF08080},
                {"lightcyan", 0xE0FFFF},
                {"lightgoldenrodyellow", 0xFAFAD2},
                {"lightgray", 0xD3D3D3},
                {"lightgreen", 0x90EE90},
                {"lightgrey", 0xD3D3D3},
                {"lightpink", 0xFFB6C1},
                {"lightsalmon", 0xFFA07A},
                {"lightseagreen", 0x20B2AA},
                {"lightskyblue", 0x87CEFA},
                {"lightslategray", 0x778899},
                {"lightslategrey", 0x778899},
                {"lightsteelblue", 0xB0C4DE},
                {"lightyellow", 0xFFFFE0},
                {"lime", 0x00FF00},
                {"limegreen", 0x32CD32},
                {"linen", 0xFAF0E6},
                {"magenta", 0xFF00FF},
                {"maroon", 0x800000},
                {"mediumaquamarine", 0x66CDAA},
                {"mediumblue", 0x0000CD},
                {"mediumorchid", 0xBA55D3},
                {"mediumpurple", 0x9370DB},
                {"mediumseagreen", 0x3CB371},
                {"mediumslateblue", 0x7B68EE},
                {"mediumspringgreen", 0x00FA9A},
                {"mediumturquoise", 0x48D1CC},
                {"mediumvioletred", 0xC71585},
                {"midnightblue", 0x191970},
                {"mintcream", 0xF5FFFA},
                {"mistyrose", 0xFFE4E1},
                {"moccasin", 0xFFE4B5},
                {"navajowhite", 0xFFDEAD},
                {"navy", 0x000080},
                {"oldlace", 0xFDF5E6},
                {"olive", 0x808000},
                {"olivedrab", 0x6B8E23},
                {"orange", 0xFFA500},
                {"orangered", 0xFF4500},
                {"orchid", 0xDA70D6},
                {"palegoldenrod", 0xEEE8AA},
                {"palegreen", 0x98FB98},
                {"paleturquoise", 0xAFEEEE},
                {"palevioletred", 0xDB7093},
                {"papayawhip", 0xFFEFD5},
                {"peachpuff", 0xFFDAB9},
                {"peru", 0xCD853F},
                {"pink", 0xFFC0CB},
                {"plum", 0xDDA0DD},
                {"powderblue", 0xB0E0E6},
                {"purple", 0x800080},
                {"rebeccapurple", 0x663399},
                {"red", 0xFF0000},
                {"rosybrown", 0xBC8F8F},
                {"royalblue", 0x4169E1},
                {"saddlebrown", 0x8B4513},
                {"salmon", 0xFA8072},
                {"sandybrown", 0xF4A460},
                {"seagreen", 0x2E8B57},
                {"seashell", 0xFFF5EE},
                {"sienna", 0xA0522D},
                {"silver", 0xC0C0C0},
                {"skyblue", 0x87CEEB},
                {"slateblue", 0x6A5ACD},
                {"slategray", 0x708090},
                {"slategrey", 0x708090},
                {"snow", 0xFFFAFA},
                {"springgreen", 0x00FF7F},
                {"steelblue", 0x4682B4},
                {"tan", 0xD2B48C},
                {"teal", 0x008080},
                {"thistle", 0xD8BFD8},
                {"tomato", 0xFF6347},
                {"turquoise", 0x40E0D0},
                {"violet", 0xEE82EE},
                {"wheat", 0xF5DEB3},
                {"white", 0xFFFFFF},
                {"whitesmoke", 0xF5F5F5},
                {"yellow", 0xFFFF00},
                {"yellowgreen", 0x9ACD32}
            };

            const color_entry_t* entry = bsearch(name, colormap, sizeof(colormap) / sizeof(color_entry_t), sizeof(color_entry_t), color_entry_compare);
            if(entry == NULL)
                return 0;
            plutovg_color_init_argb32(color, 0xFF000000 | entry->value);
        }
    }

    plutovg_skip_ws(&it, end);
    return it - data;
}